

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O1

size_t ZSTD_compressBlock_btlazy2
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,
                 ZSTD_compressionParameters *cParams,void *src,size_t srcSize)

{
  ulong *puVar1;
  int *ip_00;
  seqDef *psVar2;
  int iVar3;
  bool bVar4;
  uint uVar5;
  BYTE *pBVar6;
  int *piVar7;
  ulong uVar8;
  uint uVar9;
  BYTE *pStart;
  int *piVar10;
  ulong *puVar11;
  BYTE *ip;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong *puVar15;
  U32 UVar16;
  size_t sVar17;
  BYTE *pBVar18;
  ulong *puVar19;
  BYTE *pBVar20;
  size_t offsetFound;
  BYTE *pInLoopLimit;
  uint local_a8;
  uint local_a4;
  size_t local_a0;
  ulong *local_98;
  int *local_90;
  ulong *local_88;
  ulong *local_80;
  ZSTD_matchState_t *local_78;
  ZSTD_compressionParameters *local_70;
  uint local_64;
  uint local_60;
  uint local_5c;
  seqStore_t *local_58;
  long local_50;
  uint *local_48;
  BYTE *local_40;
  ulong *local_38;
  
  local_98 = (ulong *)((long)src + srcSize);
  local_90 = (int *)((long)src + (srcSize - 8));
  local_40 = (ms->window).base + (ms->window).dictLimit;
  local_5c = rep[1];
  piVar10 = (int *)((ulong)(local_40 == (BYTE *)src) + (long)src);
  local_60 = (int)piVar10 - (int)local_40;
  local_a4 = local_5c;
  if (local_60 < local_5c) {
    local_a4 = 0;
  }
  local_64 = *rep;
  ms->nextToUpdate3 = ms->nextToUpdate;
  local_a8 = local_64;
  if (local_60 < local_64) {
    local_a8 = 0;
  }
  local_48 = rep;
  if (piVar10 < local_90) {
    puVar19 = (ulong *)((long)local_98 + -7);
    local_80 = (ulong *)((long)local_98 + -3);
    local_88 = (ulong *)((long)local_98 + -1);
    local_78 = ms;
    local_70 = cParams;
    local_58 = seqStore;
    local_38 = puVar19;
    do {
      local_50 = -(ulong)local_a8;
      if (local_a8 == 0) {
        pBVar18 = (BYTE *)0x0;
      }
      else {
        pBVar18 = (BYTE *)0x0;
        if (*(int *)((long)piVar10 + 1) == *(int *)(((long)piVar10 + 1) - (ulong)local_a8)) {
          puVar1 = (ulong *)((long)piVar10 + 5);
          puVar15 = (ulong *)((long)piVar10 + local_50 + 5);
          puVar11 = puVar1;
          if (puVar1 < puVar19) {
            uVar12 = *puVar1 ^ *puVar15;
            uVar8 = 0;
            if (uVar12 != 0) {
              for (; (uVar12 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
              }
            }
            pBVar18 = (BYTE *)(uVar8 >> 3 & 0x1fffffff);
            if (*puVar15 == *puVar1) {
              puVar11 = (ulong *)((long)piVar10 + 0xd);
              puVar15 = (ulong *)((long)piVar10 + local_50 + 0xd);
              do {
                if (puVar19 <= puVar11) goto LAB_001672d1;
                uVar8 = *puVar15;
                uVar12 = *puVar11;
                uVar14 = uVar12 ^ uVar8;
                uVar13 = 0;
                if (uVar14 != 0) {
                  for (; (uVar14 >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
                  }
                }
                pBVar18 = (BYTE *)((long)puVar11 + ((uVar13 >> 3 & 0x1fffffff) - (long)puVar1));
                puVar11 = puVar11 + 1;
                puVar15 = puVar15 + 1;
              } while (uVar8 == uVar12);
            }
          }
          else {
LAB_001672d1:
            if ((puVar11 < local_80) && ((int)*puVar15 == (int)*puVar11)) {
              puVar11 = (ulong *)((long)puVar11 + 4);
              puVar15 = (ulong *)((long)puVar15 + 4);
            }
            if ((puVar11 < local_88) && ((short)*puVar15 == (short)*puVar11)) {
              puVar11 = (ulong *)((long)puVar11 + 2);
              puVar15 = (ulong *)((long)puVar15 + 2);
            }
            if (puVar11 < local_98) {
              puVar11 = (ulong *)((long)puVar11 + (ulong)((BYTE)*puVar15 == (BYTE)*puVar11));
            }
            pBVar18 = (BYTE *)((long)puVar11 - (long)puVar1);
          }
          pBVar18 = pBVar18 + 4;
        }
      }
      local_a0 = 99999999;
      pBVar6 = (BYTE *)ZSTD_BtFindBestMatch_selectMLS
                                 (local_78,local_70,(BYTE *)piVar10,(BYTE *)local_98,&local_a0);
      pBVar20 = pBVar18;
      if (pBVar18 < pBVar6) {
        pBVar20 = pBVar6;
      }
      if (pBVar20 < (BYTE *)0x4) {
        piVar10 = (int *)((long)piVar10 + ((long)piVar10 - (long)src >> 8) + 1);
      }
      else {
        piVar7 = piVar10;
        sVar17 = local_a0;
        if (pBVar6 <= pBVar18) {
          piVar7 = (int *)((long)piVar10 + 1);
          sVar17 = 0;
        }
        if (piVar10 < local_90) {
          do {
            ip_00 = (int *)((long)piVar10 + 1);
            if (sVar17 == 0) {
              sVar17 = 0;
            }
            else if ((local_a8 != 0) && (*ip_00 == *(int *)((long)ip_00 + local_50))) {
              puVar1 = (ulong *)((long)piVar10 + 5);
              puVar15 = (ulong *)((long)piVar10 + local_50 + 5);
              puVar11 = puVar1;
              if (puVar1 < puVar19) {
                uVar12 = *puVar1 ^ *puVar15;
                uVar8 = 0;
                if (uVar12 != 0) {
                  for (; (uVar12 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
                  }
                }
                pBVar18 = (BYTE *)(uVar8 >> 3 & 0x1fffffff);
                if (*puVar15 == *puVar1) {
                  puVar11 = (ulong *)((long)piVar10 + 0xd);
                  puVar15 = (ulong *)((long)piVar10 + local_50 + 0xd);
                  do {
                    if (puVar19 <= puVar11) goto LAB_00167434;
                    uVar8 = *puVar15;
                    uVar12 = *puVar11;
                    uVar14 = uVar12 ^ uVar8;
                    uVar13 = 0;
                    if (uVar14 != 0) {
                      for (; (uVar14 >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
                      }
                    }
                    pBVar18 = (BYTE *)((long)puVar11 + ((uVar13 >> 3 & 0x1fffffff) - (long)puVar1));
                    puVar11 = puVar11 + 1;
                    puVar15 = puVar15 + 1;
                  } while (uVar8 == uVar12);
                }
              }
              else {
LAB_00167434:
                if ((puVar11 < local_80) && ((int)*puVar15 == (int)*puVar11)) {
                  puVar11 = (ulong *)((long)puVar11 + 4);
                  puVar15 = (ulong *)((long)puVar15 + 4);
                }
                if ((puVar11 < local_88) && ((short)*puVar15 == (short)*puVar11)) {
                  puVar11 = (ulong *)((long)puVar11 + 2);
                  puVar15 = (ulong *)((long)puVar15 + 2);
                }
                if (puVar11 < local_98) {
                  puVar11 = (ulong *)((long)puVar11 + (ulong)((BYTE)*puVar15 == (BYTE)*puVar11));
                }
                pBVar18 = (BYTE *)((long)puVar11 - (long)puVar1);
              }
              if (pBVar18 < (BYTE *)0xfffffffffffffffc) {
                uVar5 = (int)sVar17 + 1;
                uVar9 = 0x1f;
                if (uVar5 != 0) {
                  for (; uVar5 >> uVar9 == 0; uVar9 = uVar9 - 1) {
                  }
                }
                if ((int)((uVar9 ^ 0x1f) + (int)pBVar20 * 3 + -0x1e) < (int)(pBVar18 + 4) * 3) {
                  sVar17 = 0;
                  pBVar20 = pBVar18 + 4;
                  piVar7 = ip_00;
                }
              }
            }
            local_a0 = 99999999;
            pBVar18 = (BYTE *)ZSTD_BtFindBestMatch_selectMLS
                                        (local_78,local_70,(BYTE *)ip_00,(BYTE *)local_98,&local_a0)
            ;
            puVar19 = local_38;
            bVar4 = true;
            if ((BYTE *)0x3 < pBVar18) {
              uVar5 = (int)sVar17 + 1;
              uVar9 = 0x1f;
              if (uVar5 != 0) {
                for (; uVar5 >> uVar9 == 0; uVar9 = uVar9 - 1) {
                }
              }
              uVar5 = (int)local_a0 + 1;
              iVar3 = 0x1f;
              if (uVar5 != 0) {
                for (; uVar5 >> iVar3 == 0; iVar3 = iVar3 + -1) {
                }
              }
              if ((int)((uVar9 ^ 0x1f) + (int)pBVar20 * 4 + -0x1b) < (int)pBVar18 * 4 - iVar3) {
                bVar4 = false;
                sVar17 = local_a0;
                pBVar20 = pBVar18;
                piVar7 = ip_00;
              }
            }
            if (bVar4) {
              if (local_90 <= ip_00) break;
              ip_00 = (int *)((long)piVar10 + 2);
              if (sVar17 == 0) {
                sVar17 = 0;
              }
              else if ((local_a8 != 0) && (*ip_00 == *(int *)((long)ip_00 + local_50))) {
                puVar1 = (ulong *)((long)piVar10 + 6);
                puVar15 = (ulong *)((long)piVar10 + local_50 + 6);
                puVar11 = puVar1;
                if (puVar1 < local_38) {
                  uVar12 = *puVar1 ^ *puVar15;
                  uVar8 = 0;
                  if (uVar12 != 0) {
                    for (; (uVar12 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
                    }
                  }
                  pBVar18 = (BYTE *)(uVar8 >> 3 & 0x1fffffff);
                  if (*puVar15 == *puVar1) {
                    puVar11 = (ulong *)((long)piVar10 + 0xe);
                    puVar15 = (ulong *)((long)piVar10 + local_50 + 0xe);
                    do {
                      if (local_38 <= puVar11) goto LAB_001675c9;
                      uVar8 = *puVar15;
                      uVar12 = *puVar11;
                      uVar14 = uVar12 ^ uVar8;
                      uVar13 = 0;
                      if (uVar14 != 0) {
                        for (; (uVar14 >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
                        }
                      }
                      pBVar18 = (BYTE *)((long)puVar11 + ((uVar13 >> 3 & 0x1fffffff) - (long)puVar1)
                                        );
                      puVar11 = puVar11 + 1;
                      puVar15 = puVar15 + 1;
                    } while (uVar8 == uVar12);
                  }
                }
                else {
LAB_001675c9:
                  if ((puVar11 < local_80) && ((int)*puVar15 == (int)*puVar11)) {
                    puVar11 = (ulong *)((long)puVar11 + 4);
                    puVar15 = (ulong *)((long)puVar15 + 4);
                  }
                  if ((puVar11 < local_88) && ((short)*puVar15 == (short)*puVar11)) {
                    puVar11 = (ulong *)((long)puVar11 + 2);
                    puVar15 = (ulong *)((long)puVar15 + 2);
                  }
                  if (puVar11 < local_98) {
                    puVar11 = (ulong *)((long)puVar11 + (ulong)((BYTE)*puVar15 == (BYTE)*puVar11));
                  }
                  pBVar18 = (BYTE *)((long)puVar11 - (long)puVar1);
                }
                if (pBVar18 < (BYTE *)0xfffffffffffffffc) {
                  uVar5 = (int)sVar17 + 1;
                  uVar9 = 0x1f;
                  if (uVar5 != 0) {
                    for (; uVar5 >> uVar9 == 0; uVar9 = uVar9 - 1) {
                    }
                  }
                  if ((int)((uVar9 ^ 0x1f) + (int)pBVar20 * 4 + -0x1e) < (int)(pBVar18 + 4) * 4) {
                    sVar17 = 0;
                    pBVar20 = pBVar18 + 4;
                    piVar7 = ip_00;
                  }
                }
              }
              local_a0 = 99999999;
              pBVar18 = (BYTE *)ZSTD_BtFindBestMatch_selectMLS
                                          (local_78,local_70,(BYTE *)ip_00,(BYTE *)local_98,
                                           &local_a0);
              bVar4 = true;
              if ((BYTE *)0x3 < pBVar18) {
                uVar5 = (int)sVar17 + 1;
                uVar9 = 0x1f;
                if (uVar5 != 0) {
                  for (; uVar5 >> uVar9 == 0; uVar9 = uVar9 - 1) {
                  }
                }
                uVar5 = (int)local_a0 + 1;
                iVar3 = 0x1f;
                if (uVar5 != 0) {
                  for (; uVar5 >> iVar3 == 0; iVar3 = iVar3 + -1) {
                  }
                }
                if ((int)((uVar9 ^ 0x1f) + (int)pBVar20 * 4 + -0x18) < (int)pBVar18 * 4 - iVar3) {
                  bVar4 = false;
                  sVar17 = local_a0;
                  pBVar20 = pBVar18;
                  piVar7 = ip_00;
                }
              }
              if (bVar4) break;
            }
            piVar10 = ip_00;
          } while (piVar10 < local_90);
        }
        if (sVar17 == 0) {
          UVar16 = 1;
        }
        else {
          if ((src < piVar7) && (local_40 < (BYTE *)((long)piVar7 + (2 - sVar17)))) {
            piVar10 = piVar7;
            while (piVar7 = piVar10,
                  *(BYTE *)((long)piVar10 + -1) == *(BYTE *)((long)piVar10 + (1 - sVar17))) {
              piVar7 = (int *)((long)piVar10 + -1);
              pBVar20 = pBVar20 + 1;
              if ((piVar7 <= src) ||
                 (pBVar18 = (BYTE *)((long)piVar10 + (1 - sVar17)), piVar10 = piVar7,
                 pBVar18 <= local_40)) break;
            }
          }
          UVar16 = (int)sVar17 + 1;
          local_a4 = local_a8;
          local_a8 = (int)sVar17 - 2;
        }
        uVar8 = (long)piVar7 - (long)src;
        pBVar6 = local_58->lit;
        pBVar18 = pBVar6 + uVar8;
        do {
          *(undefined8 *)pBVar6 = *src;
          pBVar6 = pBVar6 + 8;
          src = (void *)((long)src + 8);
        } while (pBVar6 < pBVar18);
        local_58->lit = local_58->lit + uVar8;
        if (0xffff < uVar8) {
          local_58->longLengthID = 1;
          local_58->longLengthPos =
               (U32)((ulong)((long)local_58->sequences - (long)local_58->sequencesStart) >> 3);
        }
        psVar2 = local_58->sequences;
        psVar2->litLength = (U16)uVar8;
        psVar2->offset = UVar16;
        if ((BYTE *)0xffff < pBVar20 + -3) {
          local_58->longLengthID = 2;
          local_58->longLengthPos =
               (U32)((ulong)((long)psVar2 - (long)local_58->sequencesStart) >> 3);
        }
        psVar2->matchLength = (U16)(pBVar20 + -3);
        local_58->sequences = psVar2 + 1;
        src = (void *)((long)piVar7 + (long)pBVar20);
        piVar10 = (int *)src;
        if ((local_a4 != 0) && (uVar9 = local_a4, src <= local_90)) {
          while (uVar5 = local_a8, uVar8 = (ulong)uVar9, piVar10 = (int *)src, local_a8 = uVar5,
                local_a4 = uVar9, *src == *(int *)((long)src - uVar8)) {
            puVar1 = (ulong *)((long)src + 4);
            puVar15 = (ulong *)((long)src + (4 - uVar8));
            puVar11 = puVar1;
            if (puVar1 < puVar19) {
              uVar13 = *puVar1 ^ *puVar15;
              uVar12 = 0;
              if (uVar13 != 0) {
                for (; (uVar13 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
                }
              }
              pBVar18 = (BYTE *)(uVar12 >> 3 & 0x1fffffff);
              if (*puVar15 == *puVar1) {
                puVar11 = (ulong *)((long)src + 0xc);
                puVar15 = (ulong *)((long)src + (0xc - uVar8));
                do {
                  if (puVar19 <= puVar11) goto LAB_0016785a;
                  uVar8 = *puVar15;
                  uVar12 = *puVar11;
                  uVar14 = uVar12 ^ uVar8;
                  uVar13 = 0;
                  if (uVar14 != 0) {
                    for (; (uVar14 >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
                    }
                  }
                  pBVar18 = (BYTE *)((long)puVar11 + ((uVar13 >> 3 & 0x1fffffff) - (long)puVar1));
                  puVar11 = puVar11 + 1;
                  puVar15 = puVar15 + 1;
                } while (uVar8 == uVar12);
              }
            }
            else {
LAB_0016785a:
              if ((puVar11 < local_80) && ((int)*puVar15 == (int)*puVar11)) {
                puVar11 = (ulong *)((long)puVar11 + 4);
                puVar15 = (ulong *)((long)puVar15 + 4);
              }
              if ((puVar11 < local_88) && ((short)*puVar15 == (short)*puVar11)) {
                puVar11 = (ulong *)((long)puVar11 + 2);
                puVar15 = (ulong *)((long)puVar15 + 2);
              }
              if (puVar11 < local_98) {
                puVar11 = (ulong *)((long)puVar11 + (ulong)((BYTE)*puVar15 == (BYTE)*puVar11));
              }
              pBVar18 = (BYTE *)((long)puVar11 - (long)puVar1);
            }
            *(undefined8 *)local_58->lit = *src;
            psVar2 = local_58->sequences;
            psVar2->litLength = 0;
            psVar2->offset = 1;
            if ((BYTE *)0xffff < pBVar18 + 1) {
              local_58->longLengthID = 2;
              local_58->longLengthPos =
                   (U32)((ulong)((long)psVar2 - (long)local_58->sequencesStart) >> 3);
            }
            psVar2->matchLength = (U16)(pBVar18 + 1);
            local_58->sequences = psVar2 + 1;
            src = (void *)((long)src + (long)(pBVar18 + 4));
            piVar10 = (int *)src;
            local_a8 = uVar9;
            local_a4 = uVar5;
            if ((uVar5 == 0) || (uVar9 = uVar5, local_90 < src)) break;
          }
        }
      }
    } while (piVar10 < local_90);
  }
  uVar9 = 0;
  if (local_60 < local_5c) {
    uVar9 = local_5c;
  }
  if (local_60 < local_64) {
    uVar9 = local_64;
  }
  if (local_a8 == 0) {
    local_a8 = uVar9;
  }
  if (local_a4 != 0) {
    uVar9 = local_a4;
  }
  *local_48 = local_a8;
  local_48[1] = uVar9;
  return (long)local_98 - (long)src;
}

Assistant:

size_t ZSTD_compressBlock_btlazy2(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        ZSTD_compressionParameters const* cParams, void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, cParams, src, srcSize, 1, 2);
}